

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O3

void anon_unknown.dwarf_d697::get_cpu_times(cpu_times *current)

{
  undefined1 auVar1 [16];
  long lVar2;
  rep rVar3;
  clock_t cVar4;
  ulong uVar5;
  tms tm;
  tms local_28;
  
  rVar3 = std::chrono::_V2::system_clock::now();
  (current->wall).__r = rVar3;
  cVar4 = times(&local_28);
  if (cVar4 == -1) {
    *(undefined4 *)&(current->user).__r = 0xffffffff;
    *(undefined4 *)((long)&(current->user).__r + 4) = 0xffffffff;
    *(undefined4 *)&(current->system).__r = 0xffffffff;
    *(undefined4 *)((long)&(current->system).__r + 4) = 0xffffffff;
  }
  else {
    (current->user).__r = local_28.tms_cutime + local_28.tms_utime;
    (current->system).__r = local_28.tms_cstime + local_28.tms_stime;
    if ((anonymous_namespace)::tick_factor()::tick_factor == 0) {
      uVar5 = sysconf(2);
      if ((long)uVar5 < 1) {
        (anonymous_namespace)::tick_factor()::tick_factor = -1;
      }
      else {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar5;
        (anonymous_namespace)::tick_factor()::tick_factor = -1;
        if (uVar5 < 0x3b9aca01) {
          (anonymous_namespace)::tick_factor()::tick_factor =
               SUB168((ZEXT816(0) << 0x40 | ZEXT816(1000000000)) / auVar1,0);
        }
      }
    }
    lVar2 = (anonymous_namespace)::tick_factor()::tick_factor;
    if ((anonymous_namespace)::tick_factor()::tick_factor == -1) {
      *(undefined4 *)&(current->user).__r = 0xffffffff;
      *(undefined4 *)((long)&(current->user).__r + 4) = 0xffffffff;
      *(undefined4 *)&(current->system).__r = 0xffffffff;
      *(undefined4 *)((long)&(current->system).__r + 4) = 0xffffffff;
    }
    else {
      (current->user).__r = (current->user).__r * (anonymous_namespace)::tick_factor()::tick_factor;
      (current->system).__r = lVar2 * (current->system).__r;
    }
  }
  return;
}

Assistant:

void get_cpu_times(lf::base::Timer::cpu_times* const current) {
  const std::chrono::nanoseconds x(
      std::chrono::high_resolution_clock::now().time_since_epoch());
  current->wall = std::chrono::nanoseconds(x.count());

#if defined(_WIN32) || defined(WIN32)

  FILETIME creation, exit;
  if (::GetProcessTimes(::GetCurrentProcess(), &creation, &exit,
                        (LPFILETIME)&current->system,
                        (LPFILETIME)&current->user)) {
    current->user *= 100;  // Windows uses 100 nanosecond ticks
    current->system *= 100;
  } else

  {
    current->system = current->user = std::chrono::nanoseconds(-1);
  }
#else
  tms tm;  // NOLINT
  const clock_t c = ::times(&tm);
  if (c == static_cast<clock_t>(-1))  // error
  {
    current->system = current->user = std::chrono::nanoseconds(-1);
  } else {
    current->system = std::chrono::nanoseconds(tm.tms_stime + tm.tms_cstime);
    current->user = std::chrono::nanoseconds(tm.tms_utime + tm.tms_cutime);
    int_least64_t factor;
    if (factor = tick_factor(); factor != -1) {
      current->user *= factor;
      current->system *= factor;
    } else {
      current->user = current->system = std::chrono::nanoseconds(-1);
    }
  }
#endif
}